

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.hpp
# Opt level: O0

void __thiscall
SimpleBVH::BVH::intersect_box
          (BVH *this,VectorMax3d *bbd0,VectorMax3d *bbd1,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *list)

{
  value_type vVar1;
  pointer this_00;
  Index IVar2;
  Index IVar3;
  size_type sVar4;
  reference pvVar5;
  value_type *pvVar6;
  bool bVar7;
  int local_50;
  int i;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *list_local;
  VectorMax3d *bbd1_local;
  VectorMax3d *bbd0_local;
  BVH *this_local;
  
  tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)list;
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)bbd0);
  bVar7 = true;
  if (IVar2 != 2) {
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)bbd0);
    bVar7 = IVar2 == 3;
  }
  if (!bVar7) {
    __assert_fail("bbd0.size() == 2 || bbd0.size() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.hpp"
                  ,0x30,
                  "void SimpleBVH::BVH::intersect_box(const VectorMax3d &, const VectorMax3d &, std::vector<unsigned int> &) const"
                 );
  }
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)bbd0);
  IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)bbd1);
  if (IVar2 != IVar3) {
    __assert_fail("bbd0.size() == bbd1.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.hpp"
                  ,0x31,
                  "void SimpleBVH::BVH::intersect_box(const VectorMax3d &, const VectorMax3d &, std::vector<unsigned int> &) const"
                 );
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  if (-1 < this->n_corners) {
    box_search_recursive
              (this,bbd0,bbd1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,1,0,
               (int)this->n_corners);
    this_00 = tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,sVar4);
    local_50 = 0;
    while( true ) {
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      if (sVar4 <= (ulong)(long)local_50) break;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                          (long)local_50);
      pvVar6 = (value_type *)
               std::vector<int,_std::allocator<int>_>::operator[](&this->new2old,(ulong)*pvVar5);
      vVar1 = *pvVar6;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_50);
      *pvVar5 = vVar1;
      local_50 = local_50 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    return;
  }
  __assert_fail("n_corners >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.hpp"
                ,0x34,
                "void SimpleBVH::BVH::intersect_box(const VectorMax3d &, const VectorMax3d &, std::vector<unsigned int> &) const"
               );
}

Assistant:

void intersect_box(
        const VectorMax3d& bbd0,
        const VectorMax3d& bbd1,
        std::vector<unsigned int>& list) const
    {
        assert(bbd0.size() == 2 || bbd0.size() == 3);
        assert(bbd0.size() == bbd1.size());

        std::vector<unsigned int> tmp;
        assert(n_corners >= 0);
        box_search_recursive(bbd0, bbd1, tmp, 1, 0, n_corners);

        list.resize(tmp.size());
        for (int i = 0; i < tmp.size(); ++i)
            list[i] = new2old[tmp[i]];
    }